

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

string * __thiscall UniformData::print_abi_cxx11_(string *__return_storage_ptr__,UniformData *this)

{
  ulong uVar1;
  ulong uVar2;
  UniformValue *_value;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (this->size != 0) {
    _value = &this->value;
    uVar2 = 0;
    do {
      vera::toString<float>(&local_50,_value->_M_elems);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = this->size;
      if (uVar2 < uVar1 - 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar1 = this->size;
      }
      uVar2 = uVar2 + 1;
      _value = (UniformValue *)(_value->_M_elems + 1);
    } while (uVar2 < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UniformData::print() {
    std::string rta = "";
    for (size_t i = 0; i < size; i++) {
        rta += vera::toString(value[i]);
        if (i < size - 1)
            rta += ",";
    }
    return rta;
}